

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileNotFoundException.h
# Opt level: O0

void __thiscall
FileNotFoundException::FileNotFoundException(FileNotFoundException *this,string *filename)

{
  string *filename_local;
  FileNotFoundException *this_local;
  
  CustomException::CustomException(&this->super_CustomException);
  std::__cxx11::string::string((string *)&this->filename);
  std::__cxx11::string::operator=((string *)&this->filename,(string *)filename);
  return;
}

Assistant:

FileNotFoundException( string filename ){this->filename=filename;}